

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeT2STRDPreInstruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  _Bool _Var1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t RegNo;
  uint32_t uVar7;
  uint Val;
  DecodeStatus DVar8;
  uint32_t in_ESI;
  _Bool writeback;
  uint P;
  uint U;
  uint W;
  uint addr;
  uint Rn;
  uint Rt2;
  uint Rt;
  DecodeStatus S;
  void *in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 uVar9;
  DecodeStatus local_2c [6];
  uint32_t local_14;
  DecodeStatus local_4;
  
  local_2c[0] = MCDisassembler_Success;
  local_14 = in_ESI;
  uVar2 = fieldFromInstruction_4(in_ESI,0xc,4);
  uVar3 = fieldFromInstruction_4(local_14,8,4);
  uVar4 = fieldFromInstruction_4(local_14,0x10,4);
  uVar5 = fieldFromInstruction_4(local_14,0,8);
  uVar6 = fieldFromInstruction_4(local_14,0x15,1);
  RegNo = fieldFromInstruction_4(local_14,0x17,1);
  uVar7 = fieldFromInstruction_4(local_14,0x18,1);
  uVar9 = uVar6 == 1 || uVar7 == 0;
  Val = RegNo << 8 | uVar4 << 9 | uVar5;
  if ((uVar6 == 1 || uVar7 == 0) && ((uVar4 == uVar2 || (uVar4 == uVar3)))) {
    Check(local_2c,MCDisassembler_SoftFail);
  }
  DVar8 = DecoderGPRRegisterClass
                    ((MCInst *)CONCAT44(Val,uVar6),RegNo,CONCAT17(uVar9,in_stack_ffffffffffffffb0),
                     in_stack_ffffffffffffffa8);
  _Var1 = Check(local_2c,DVar8);
  if (_Var1) {
    DVar8 = DecoderGPRRegisterClass
                      ((MCInst *)CONCAT44(Val,uVar6),RegNo,CONCAT17(uVar9,in_stack_ffffffffffffffb0)
                       ,in_stack_ffffffffffffffa8);
    _Var1 = Check(local_2c,DVar8);
    if (_Var1) {
      DVar8 = DecoderGPRRegisterClass
                        ((MCInst *)CONCAT44(Val,uVar6),RegNo,
                         CONCAT17(uVar9,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffa8);
      _Var1 = Check(local_2c,DVar8);
      if (_Var1) {
        DVar8 = DecodeT2AddrModeImm8s4
                          ((MCInst *)CONCAT44(uVar3,uVar4),Val,CONCAT44(RegNo,uVar7),
                           (void *)CONCAT17(uVar9,in_stack_ffffffffffffffb0));
        _Var1 = Check(local_2c,DVar8);
        if (_Var1) {
          local_4 = local_2c[0];
        }
        else {
          local_4 = MCDisassembler_Fail;
        }
      }
      else {
        local_4 = MCDisassembler_Fail;
      }
    }
    else {
      local_4 = MCDisassembler_Fail;
    }
  }
  else {
    local_4 = MCDisassembler_Fail;
  }
  return local_4;
}

Assistant:

static DecodeStatus DecodeT2STRDPreInstruction(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;

	unsigned Rt = fieldFromInstruction_4(Insn, 12, 4);
	unsigned Rt2 = fieldFromInstruction_4(Insn, 8, 4);
	unsigned Rn = fieldFromInstruction_4(Insn, 16, 4);
	unsigned addr = fieldFromInstruction_4(Insn, 0, 8);
	unsigned W = fieldFromInstruction_4(Insn, 21, 1);
	unsigned U = fieldFromInstruction_4(Insn, 23, 1);
	unsigned P = fieldFromInstruction_4(Insn, 24, 1);
	bool writeback = (W == 1) | (P == 0);

	addr |= (U << 8) | (Rn << 9);

	if (writeback && (Rn == Rt || Rn == Rt2))
		Check(&S, MCDisassembler_SoftFail);

	// Writeback operand
	if (!Check(&S, DecoderGPRRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;
	// Rt
	if (!Check(&S, DecoderGPRRegisterClass(Inst, Rt, Address, Decoder)))
		return MCDisassembler_Fail;
	// Rt2
	if (!Check(&S, DecoderGPRRegisterClass(Inst, Rt2, Address, Decoder)))
		return MCDisassembler_Fail;
	// addr
	if (!Check(&S, DecodeT2AddrModeImm8s4(Inst, addr, Address, Decoder)))
		return MCDisassembler_Fail;

	return S;
}